

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubidi_props.cpp
# Opt level: O2

UJoiningGroup ubidi_getJoiningGroup_63(UChar32 c)

{
  long lVar1;
  uint8_t *puVar2;
  
  if (c - 0x620U < 0x2a0) {
    lVar1 = -0x620;
    puVar2 = "-";
  }
  else {
    if (0x263 < c - 0x10ac0U) {
      return U_JG_NO_JOINING_GROUP;
    }
    lVar1 = -0x10ac0;
    puVar2 = ":<<@@=";
  }
  return (uint)puVar2[lVar1 + (ulong)(uint)c];
}

Assistant:

U_CFUNC UJoiningGroup
ubidi_getJoiningGroup(UChar32 c) {
    UChar32 start, limit;

    start=ubidi_props_singleton.indexes[UBIDI_IX_JG_START];
    limit=ubidi_props_singleton.indexes[UBIDI_IX_JG_LIMIT];
    if(start<=c && c<limit) {
        return (UJoiningGroup)ubidi_props_singleton.jgArray[c-start];
    }
    start=ubidi_props_singleton.indexes[UBIDI_IX_JG_START2];
    limit=ubidi_props_singleton.indexes[UBIDI_IX_JG_LIMIT2];
    if(start<=c && c<limit) {
        return (UJoiningGroup)ubidi_props_singleton.jgArray2[c-start];
    }
    return U_JG_NO_JOINING_GROUP;
}